

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

bool tchecker::ta::has_guarded_weakly_synchronized_event(system_t *system)

{
  bool bVar1;
  const_iterator __r;
  typed_expression_t *ptVar2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar3;
  process_events_map_t weakly_sync_map;
  process_id_t *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  process_events_map_t local_48;
  
  tchecker::system::weakly_synchronized_events(&local_48,(system_t *)system);
  rVar3 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  for (__r._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar3._begin.super_const_iterator._M_current;
      (const_iterator)__r._M_current !=
      rVar3._end.super_const_iterator._M_current.super_const_iterator;
      __r._M_current = __r._M_current + 1) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &(__r._M_current)->
                super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>);
    bVar1 = tchecker::system::process_events_map_t::contains(&local_48,*local_58,local_58[4]);
    if (bVar1) {
      ptVar2 = system_t::guard(system,local_58[1]);
      const_evaluate((expression_t *)(&ptVar2->field_0x0 + *(long *)(*(long *)ptVar2 + -0x38)));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  }
  std::
  vector<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
  ::~vector(&local_48._map);
  return (const_iterator)__r._M_current !=
         rVar3._end.super_const_iterator._M_current.super_const_iterator;
}

Assistant:

bool has_guarded_weakly_synchronized_event(tchecker::ta::system_t const & system)
{
  tchecker::system::process_events_map_t weakly_sync_map =
      tchecker::system::weakly_synchronized_events(system.as_system_system());

  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    if (weakly_sync_map.contains(edge->pid(), edge->event_id())) {
      try {
        tchecker::const_evaluate(system.guard(edge->id()));
      }
      catch (...) {
        return true;
      }
    }
  }
  return false;
}